

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesglobaltypes.cpp
# Opt level: O2

bool __thiscall
StimulationCommand::setChannels
          (StimulationCommand *this,int cathodeNTrode,int cathodeChan,int anodeNTrode,int anodeChan)

{
  if (-1 < (anodeChan | cathodeChan)) {
    this->cathodeChannel = (uint16_t)cathodeChan;
    this->anodeChannel = (uint16_t)anodeChan;
    this->cathodeNtrodeID = (uint16_t)cathodeNTrode;
    this->anodeNtrodeID = (uint16_t)anodeNTrode;
    this->channelIsSet = true;
  }
  return -1 < (anodeChan | cathodeChan);
}

Assistant:

bool StimulationCommand::setChannels(int cathodeNTrode, int cathodeChan, int anodeNTrode, int anodeChan) {
    if ( (cathodeChan < 0) || (anodeChan < 0)) { //maybe also check that the channels are stim capable?
        return false;
    }

    cathodeChannel = cathodeChan;
    anodeChannel = anodeChan;
    cathodeNtrodeID = cathodeNTrode;
    anodeNtrodeID = anodeNTrode;
    channelIsSet = true;
    return true;
}